

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O1

BrotliDecoderErrorCode DecodeMetaBlockLength(BrotliDecoderStateInternal *s,BrotliBitReader *br)

{
  ulong uVar1;
  int iVar2;
  ushort uVar3;
  BrotliRunningMetablockHeaderState BVar4;
  uint uVar5;
  uint32_t uVar6;
  uint uVar7;
  ulong in_RDX;
  uint uVar8;
  bool bVar9;
  
  BVar4 = s->substate_metablock_header;
  do {
    uVar7 = (uint)in_RDX;
    switch(BVar4) {
    case BROTLI_STATE_METABLOCK_HEADER_NONE:
      uVar7 = br->bit_pos_;
      bVar9 = uVar7 == 0x40;
      if (bVar9) {
        if (br->avail_in != 0) {
          uVar1 = br->val_;
          br->val_ = uVar1 >> 8;
          br->val_ = (ulong)*br->next_in << 0x38 | uVar1 >> 8;
          uVar7 = 0x38;
          br->bit_pos_ = 0x38;
          br->avail_in = br->avail_in - 1;
          br->next_in = br->next_in + 1;
          bVar9 = false;
          goto LAB_0010238f;
        }
      }
      else {
LAB_0010238f:
        in_RDX = (ulong)((br->val_ >> ((ulong)uVar7 & 0x3f) & 1) != 0);
        br->bit_pos_ = uVar7 + 1;
      }
      if (bVar9) {
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      s->meta_block_remaining_len = 0;
      *(ushort *)&s->field_0x13e8 =
           (ushort)*(undefined4 *)&s->field_0x13e8 & 0xfff8 | (ushort)((int)in_RDX != 0);
      if ((int)in_RDX != 0) {
        s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_EMPTY;
        goto switchD_00102344_caseD_1;
      }
      BVar4 = BROTLI_STATE_METABLOCK_HEADER_NIBBLES;
      goto LAB_001024fd;
    case BROTLI_STATE_METABLOCK_HEADER_EMPTY:
switchD_00102344_caseD_1:
      uVar7 = br->bit_pos_;
      bVar9 = uVar7 == 0x40;
      if (bVar9) {
        if (br->avail_in != 0) {
          uVar1 = br->val_;
          br->val_ = uVar1 >> 8;
          br->val_ = (ulong)*br->next_in << 0x38 | uVar1 >> 8;
          uVar7 = 0x38;
          br->bit_pos_ = 0x38;
          br->avail_in = br->avail_in - 1;
          br->next_in = br->next_in + 1;
          bVar9 = false;
          goto LAB_0010242b;
        }
      }
      else {
LAB_0010242b:
        in_RDX = (ulong)((br->val_ >> ((ulong)uVar7 & 0x3f) & 1) != 0);
        br->bit_pos_ = uVar7 + 1;
      }
      if (bVar9) {
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      if ((int)in_RDX != 0) goto LAB_00102863;
      s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_NIBBLES;
    case BROTLI_STATE_METABLOCK_HEADER_NIBBLES:
      uVar6 = br->bit_pos_;
      bVar9 = uVar6 - 0x3f < 2;
      if (bVar9) {
        if (br->avail_in != 0) {
          uVar1 = br->val_;
          br->val_ = uVar1 >> 8;
          br->val_ = (ulong)*br->next_in << 0x38 | uVar1 >> 8;
          uVar6 = uVar6 - 8;
          br->bit_pos_ = uVar6;
          br->avail_in = br->avail_in - 1;
          br->next_in = br->next_in + 1;
          bVar9 = false;
          goto LAB_001024a5;
        }
      }
      else {
LAB_001024a5:
        in_RDX = (ulong)((uint)(br->val_ >> ((byte)uVar6 & 0x3f)) & 3);
        br->bit_pos_ = uVar6 + 2;
      }
      if (bVar9) {
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      uVar3 = (ushort)*(undefined4 *)&s->field_0x13e8 & 0xf00f |
              (short)in_RDX * 0x10 + 0x40U & 0xff0;
      *(ushort *)&s->field_0x13e8 = uVar3;
      s->loop_counter = 0;
      if ((int)in_RDX != 3) {
        s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_SIZE;
        goto switchD_00102344_caseD_3;
      }
      *(ushort *)&s->field_0x13e8 = uVar3 | 4;
      BVar4 = BROTLI_STATE_METABLOCK_HEADER_RESERVED;
LAB_001024fd:
      s->substate_metablock_header = BVar4;
      break;
    case BROTLI_STATE_METABLOCK_HEADER_SIZE:
      goto switchD_00102344_caseD_3;
    case BROTLI_STATE_METABLOCK_HEADER_UNCOMPRESSED:
      goto switchD_00102344_caseD_4;
    case BROTLI_STATE_METABLOCK_HEADER_RESERVED:
      uVar7 = br->bit_pos_;
      bVar9 = uVar7 == 0x40;
      if (bVar9) {
        if (br->avail_in != 0) {
          uVar1 = br->val_;
          br->val_ = uVar1 >> 8;
          br->val_ = (ulong)*br->next_in << 0x38 | uVar1 >> 8;
          uVar7 = 0x38;
          br->bit_pos_ = 0x38;
          br->avail_in = br->avail_in - 1;
          br->next_in = br->next_in + 1;
          bVar9 = false;
          goto LAB_001026cb;
        }
      }
      else {
LAB_001026cb:
        in_RDX = (ulong)((br->val_ >> ((ulong)uVar7 & 0x3f) & 1) != 0);
        br->bit_pos_ = uVar7 + 1;
      }
      if (bVar9) {
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      if ((int)in_RDX != 0) {
        return BROTLI_DECODER_ERROR_FORMAT_RESERVED;
      }
      s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_BYTES;
    case BROTLI_STATE_METABLOCK_HEADER_BYTES:
      uVar6 = br->bit_pos_;
      bVar9 = uVar6 - 0x3f < 2;
      if (bVar9) {
        if (br->avail_in != 0) {
          uVar1 = br->val_;
          br->val_ = uVar1 >> 8;
          br->val_ = (ulong)*br->next_in << 0x38 | uVar1 >> 8;
          uVar6 = uVar6 - 8;
          br->bit_pos_ = uVar6;
          br->avail_in = br->avail_in - 1;
          br->next_in = br->next_in + 1;
          bVar9 = false;
          goto LAB_0010274c;
        }
      }
      else {
LAB_0010274c:
        in_RDX = (ulong)((uint)(br->val_ >> ((byte)uVar6 & 0x3f)) & 3);
        br->bit_pos_ = uVar6 + 2;
      }
      if (bVar9) {
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      if ((uint)in_RDX == 0) goto LAB_00102863;
      *(ushort *)&s->field_0x13e8 =
           (ushort)*(undefined4 *)&s->field_0x13e8 & 0xf00f | (ushort)(((uint)in_RDX & 0xff) << 4);
      s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_METADATA;
switchD_00102344_caseD_7:
      uVar8 = s->loop_counter;
      if ((int)(*(uint *)&s->field_0x13e8 >> 4 & 0xff) <= (int)uVar8) goto LAB_0010285d;
      iVar2 = uVar8 * 8;
      goto LAB_001027b6;
    case BROTLI_STATE_METABLOCK_HEADER_METADATA:
      goto switchD_00102344_caseD_7;
    default:
      return BROTLI_DECODER_ERROR_UNREACHABLE;
    }
  } while( true );
  while( true ) {
    uVar8 = uVar8 + 1;
    uVar7 = *(uint *)&s->field_0x13e8 >> 4 & 0xff;
    if (((uVar8 == uVar7) && (1 < (ushort)uVar7)) && ((int)in_RDX == 0)) {
      return BROTLI_DECODER_ERROR_FORMAT_EXUBERANT_META_NIBBLE;
    }
    s->meta_block_remaining_len = s->meta_block_remaining_len | (int)in_RDX << ((byte)iVar2 & 0x1f);
    iVar2 = iVar2 + 8;
    if ((int)(*(uint *)&s->field_0x13e8 >> 4 & 0xff) <= (int)uVar8) break;
LAB_001027b6:
    uVar6 = br->bit_pos_;
    bVar9 = uVar6 - 0x39 < 8;
    if (bVar9) {
      if (br->avail_in != 0) {
        uVar1 = br->val_;
        br->val_ = uVar1 >> 8;
        br->val_ = (ulong)*br->next_in << 0x38 | uVar1 >> 8;
        uVar6 = uVar6 - 8;
        br->bit_pos_ = uVar6;
        br->avail_in = br->avail_in - 1;
        br->next_in = br->next_in + 1;
        bVar9 = false;
        goto LAB_00102804;
      }
    }
    else {
LAB_00102804:
      in_RDX = br->val_ >> ((byte)uVar6 & 0x3f) & 0xff;
      br->bit_pos_ = uVar6 + 8;
    }
    if (bVar9) goto LAB_00102879;
  }
  goto LAB_0010285d;
switchD_00102344_caseD_3:
  uVar7 = (uint)in_RDX;
  uVar8 = s->loop_counter;
  if ((int)uVar8 < (int)(*(uint *)&s->field_0x13e8 >> 4 & 0xff)) {
    iVar2 = uVar8 * 4;
    do {
      uVar6 = br->bit_pos_;
      bVar9 = uVar6 - 0x3d < 4;
      if (bVar9) {
        if (br->avail_in != 0) {
          uVar1 = br->val_;
          br->val_ = uVar1 >> 8;
          br->val_ = (ulong)*br->next_in << 0x38 | uVar1 >> 8;
          uVar6 = uVar6 - 8;
          br->bit_pos_ = uVar6;
          br->avail_in = br->avail_in - 1;
          br->next_in = br->next_in + 1;
          bVar9 = false;
          goto LAB_00102588;
        }
      }
      else {
LAB_00102588:
        in_RDX = (ulong)((uint)(br->val_ >> ((byte)uVar6 & 0x3f)) & 0xf);
        br->bit_pos_ = uVar6 + 4;
      }
      uVar7 = (uint)in_RDX;
      if (bVar9) {
LAB_00102879:
        s->loop_counter = uVar8;
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      uVar8 = uVar8 + 1;
      uVar5 = *(uint *)&s->field_0x13e8 >> 4 & 0xff;
      if (((uVar8 == uVar5) && (4 < (ushort)uVar5)) && (uVar7 == 0)) {
        return BROTLI_DECODER_ERROR_FORMAT_EXUBERANT_NIBBLE;
      }
      s->meta_block_remaining_len = s->meta_block_remaining_len | uVar7 << ((byte)iVar2 & 0x1f);
      iVar2 = iVar2 + 4;
    } while ((int)uVar8 < (int)(*(uint *)&s->field_0x13e8 >> 4 & 0xff));
  }
  s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_UNCOMPRESSED;
switchD_00102344_caseD_4:
  if ((s->field_0x13e8 & 1) != 0) goto LAB_0010285d;
  uVar8 = br->bit_pos_;
  bVar9 = uVar8 == 0x40;
  if (bVar9) {
    if (br->avail_in != 0) {
      uVar1 = br->val_;
      br->val_ = uVar1 >> 8;
      br->val_ = (ulong)*br->next_in << 0x38 | uVar1 >> 8;
      uVar8 = 0x38;
      br->bit_pos_ = 0x38;
      br->avail_in = br->avail_in - 1;
      br->next_in = br->next_in + 1;
      bVar9 = false;
      goto LAB_00102647;
    }
  }
  else {
LAB_00102647:
    uVar7 = (uint)((br->val_ >> ((ulong)uVar8 & 0x3f) & 1) != 0);
    br->bit_pos_ = uVar8 + 1;
  }
  if (bVar9) {
    return BROTLI_DECODER_NEEDS_MORE_INPUT;
  }
  *(ushort *)&s->field_0x13e8 =
       ((ushort)*(undefined4 *)&s->field_0x13e8 & 0xfffd) + (ushort)(uVar7 != 0) * 2;
LAB_0010285d:
  s->meta_block_remaining_len = s->meta_block_remaining_len + 1;
LAB_00102863:
  s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_NONE;
  return BROTLI_DECODER_SUCCESS;
}

Assistant:

static BrotliDecoderErrorCode BROTLI_NOINLINE DecodeMetaBlockLength(
    BrotliDecoderState* s, BrotliBitReader* br) {
  uint32_t bits;
  int i;
  for (;;) {
    switch (s->substate_metablock_header) {
      case BROTLI_STATE_METABLOCK_HEADER_NONE:
        if (!BrotliSafeReadBits(br, 1, &bits)) {
          return BROTLI_DECODER_NEEDS_MORE_INPUT;
        }
        s->is_last_metablock = bits ? 1 : 0;
        s->meta_block_remaining_len = 0;
        s->is_uncompressed = 0;
        s->is_metadata = 0;
        if (!s->is_last_metablock) {
          s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_NIBBLES;
          break;
        }
        s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_EMPTY;
        /* No break, transit to the next state. */

      case BROTLI_STATE_METABLOCK_HEADER_EMPTY:
        if (!BrotliSafeReadBits(br, 1, &bits)) {
          return BROTLI_DECODER_NEEDS_MORE_INPUT;
        }
        if (bits) {
          s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_NONE;
          return BROTLI_DECODER_SUCCESS;
        }
        s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_NIBBLES;
        /* No break, transit to the next state. */

      case BROTLI_STATE_METABLOCK_HEADER_NIBBLES:
        if (!BrotliSafeReadBits(br, 2, &bits)) {
          return BROTLI_DECODER_NEEDS_MORE_INPUT;
        }
        s->size_nibbles = (uint8_t)(bits + 4);
        s->loop_counter = 0;
        if (bits == 3) {
          s->is_metadata = 1;
          s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_RESERVED;
          break;
        }
        s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_SIZE;
        /* No break, transit to the next state. */

      case BROTLI_STATE_METABLOCK_HEADER_SIZE:
        i = s->loop_counter;
        for (; i < (int)s->size_nibbles; ++i) {
          if (!BrotliSafeReadBits(br, 4, &bits)) {
            s->loop_counter = i;
            return BROTLI_DECODER_NEEDS_MORE_INPUT;
          }
          if (i + 1 == s->size_nibbles && s->size_nibbles > 4 && bits == 0) {
            return BROTLI_FAILURE(BROTLI_DECODER_ERROR_FORMAT_EXUBERANT_NIBBLE);
          }
          s->meta_block_remaining_len |= (int)(bits << (i * 4));
        }
        s->substate_metablock_header =
            BROTLI_STATE_METABLOCK_HEADER_UNCOMPRESSED;
        /* No break, transit to the next state. */

      case BROTLI_STATE_METABLOCK_HEADER_UNCOMPRESSED:
        if (!s->is_last_metablock) {
          if (!BrotliSafeReadBits(br, 1, &bits)) {
            return BROTLI_DECODER_NEEDS_MORE_INPUT;
          }
          s->is_uncompressed = bits ? 1 : 0;
        }
        ++s->meta_block_remaining_len;
        s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_NONE;
        return BROTLI_DECODER_SUCCESS;

      case BROTLI_STATE_METABLOCK_HEADER_RESERVED:
        if (!BrotliSafeReadBits(br, 1, &bits)) {
          return BROTLI_DECODER_NEEDS_MORE_INPUT;
        }
        if (bits != 0) {
          return BROTLI_FAILURE(BROTLI_DECODER_ERROR_FORMAT_RESERVED);
        }
        s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_BYTES;
        /* No break, transit to the next state. */

      case BROTLI_STATE_METABLOCK_HEADER_BYTES:
        if (!BrotliSafeReadBits(br, 2, &bits)) {
          return BROTLI_DECODER_NEEDS_MORE_INPUT;
        }
        if (bits == 0) {
          s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_NONE;
          return BROTLI_DECODER_SUCCESS;
        }
        s->size_nibbles = (uint8_t)bits;
        s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_METADATA;
        /* No break, transit to the next state. */

      case BROTLI_STATE_METABLOCK_HEADER_METADATA:
        i = s->loop_counter;
        for (; i < (int)s->size_nibbles; ++i) {
          if (!BrotliSafeReadBits(br, 8, &bits)) {
            s->loop_counter = i;
            return BROTLI_DECODER_NEEDS_MORE_INPUT;
          }
          if (i + 1 == s->size_nibbles && s->size_nibbles > 1 && bits == 0) {
            return BROTLI_FAILURE(
                BROTLI_DECODER_ERROR_FORMAT_EXUBERANT_META_NIBBLE);
          }
          s->meta_block_remaining_len |= (int)(bits << (i * 8));
        }
        ++s->meta_block_remaining_len;
        s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_NONE;
        return BROTLI_DECODER_SUCCESS;

      default:
        return
            BROTLI_FAILURE(BROTLI_DECODER_ERROR_UNREACHABLE);
    }
  }
}